

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O3

EdwardsPoint * ecc_edwards_multiply(EdwardsPoint *B,mp_int *n)

{
  uint swap;
  EdwardsPoint *orig;
  EdwardsPoint *P;
  EdwardsPoint *Q;
  size_t bit;
  uint overwrite;
  EdwardsPoint *Q_00;
  EdwardsPoint *P_00;
  
  orig = ecc_edwards_add(B,B);
  P = ecc_edwards_point_copy(B);
  Q = ecc_edwards_point_copy(orig);
  bit = mp_max_bits(n);
  if (bit != 0) {
    overwrite = 1;
    Q_00 = Q;
    P_00 = P;
    do {
      bit = bit - 1;
      swap = mp_get_bit(n,bit);
      Q = ecc_edwards_add(P_00,Q_00);
      ecc_edwards_cond_swap(P_00,Q_00,swap);
      P = ecc_edwards_add(P_00,P_00);
      ecc_edwards_point_free(P_00);
      ecc_edwards_point_free(Q_00);
      ecc_edwards_cond_swap(P,Q,swap);
      ecc_edwards_cond_overwrite(P,B,overwrite);
      ecc_edwards_cond_overwrite(Q,orig,overwrite);
      overwrite = overwrite & ~swap;
      Q_00 = Q;
      P_00 = P;
    } while (bit != 0);
  }
  ecc_edwards_point_free(orig);
  ecc_edwards_point_free(Q);
  return P;
}

Assistant:

EdwardsPoint *ecc_edwards_multiply(EdwardsPoint *B, mp_int *n)
{
    EdwardsPoint *two_B = ecc_edwards_add(B, B);
    EdwardsPoint *k_B = ecc_edwards_point_copy(B);
    EdwardsPoint *kplus1_B = ecc_edwards_point_copy(two_B);

    /*
     * Another copy of the same exponentiation routine following the
     * pattern of the Montgomery ladder, because it works as well as
     * any other technique and this way I didn't have to debug two of
     * them.
     */

    unsigned not_started_yet = 1;
    for (size_t bitindex = mp_max_bits(n); bitindex-- > 0 ;) {
        unsigned nbit = mp_get_bit(n, bitindex);

        EdwardsPoint *sum = ecc_edwards_add(k_B, kplus1_B);
        ecc_edwards_cond_swap(k_B, kplus1_B, nbit);
        EdwardsPoint *other = ecc_edwards_add(k_B, k_B);
        ecc_edwards_point_free(k_B);
        ecc_edwards_point_free(kplus1_B);
        k_B = other;
        kplus1_B = sum;
        ecc_edwards_cond_swap(k_B, kplus1_B, nbit);

        ecc_edwards_cond_overwrite(k_B, B, not_started_yet);
        ecc_edwards_cond_overwrite(kplus1_B, two_B, not_started_yet);
        not_started_yet &= ~nbit;
    }

    ecc_edwards_point_free(two_B);
    ecc_edwards_point_free(kplus1_B);
    return k_B;
}